

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTcSymProp::gen_code_addr(CTcSymProp *this)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *pCVar3;
  
  CTcGenTarg::write_op(G_cg,'\n');
  CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,(uint)(this->super_CTcSymPropBase).prop_);
  pCVar3 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar3->max_sp_depth_ <= iVar2) {
    pCVar3->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTcSymProp::gen_code_addr()
{
    /* write code to push the property ID */
    G_cg->write_op(OPC_PUSHPROPID);
    G_cs->write_prop_id(prop_);

    /* note the push */
    G_cg->note_push();
}